

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O2

bool NormaliseTrack(CylHead *cylhead,Track *track)

{
  uint8_t *buf;
  bool bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  Sector *pSVar5;
  Sector *pSVar6;
  Data *pDVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  long lVar9;
  Sector *this;
  undefined8 extraout_RAX;
  _Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
  *this_00;
  iterator iVar10;
  undefined4 uVar11;
  undefined7 uVar13;
  pointer puVar12;
  char *pcsz_;
  MsgType type;
  ulong uVar14;
  Track *__range2;
  uint uVar15;
  uint uVar16;
  int weak_offset;
  uint local_194;
  CylHead *local_190;
  int gap3;
  const_iterator cStack_180;
  _Base_ptr local_178;
  _Base_ptr local_170;
  size_t local_160;
  int weak_size;
  pointer local_148;
  pair<int,_unsigned_char> key;
  string str_method;
  Data fill8;
  char *local_e8;
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  local_e0;
  Track local_b0;
  vector<Data,_std::allocator<Data>_> local_88;
  Track local_70;
  vector<Data,_std::allocator<Data>_> local_48;
  
  if (opt.offsets == 0) {
    track->tracklen = 0;
  }
  pSVar6 = (Sector *)0x0;
  uVar15 = 0;
  local_190 = cylhead;
  while (iVar3 = Track::size(track), (int)uVar15 < iVar3) {
    uVar14 = (ulong)pSVar6 & 0xffffffff;
    pSVar5 = Track::operator[](track,uVar15);
    uVar16 = uVar15;
    if (opt.nodups != 0) {
      do {
        local_194 = uVar16;
        uVar15 = uVar15 + 1;
        while( true ) {
          iVar3 = Track::size(track);
          uVar16 = local_194;
          if (iVar3 <= (int)uVar15) goto LAB_001633f7;
          pSVar6 = Track::operator[](track,uVar15);
          bVar1 = Header::compare_chrn(&pSVar6->header,&pSVar5->header);
          uVar16 = local_194;
          if ((!bVar1) || (pSVar6->encoding != pSVar5->encoding)) break;
          Track::remove(&local_70,(char *)track);
          std::vector<Data,_std::allocator<Data>_>::~vector(&local_48);
          uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
        }
      } while( true );
    }
LAB_001633f7:
    if ((opt.nodata != 0) && (bVar1 = Sector::has_data(pSVar5), bVar1)) {
      Sector::remove_data(pSVar5);
      _gap3 = (pointer)0x0;
      cStack_180._M_current = (uchar *)0x0;
      local_178 = (_Base_ptr)0x0;
      Sector::add(pSVar5,(Data *)&gap3,false,0xfb);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3);
      uVar14 = CONCAT71((int7)((ulong)&gap3 >> 8),1);
    }
    if (opt.offsets == 0) {
      pSVar5->offset = 0;
    }
    bVar1 = Sector::has_gapdata(pSVar5);
    if (bVar1) {
      if ((opt.gaps != 0) && (((uint)opt.gapmask >> (uVar16 & 0x1f) & 1) != 0)) {
        if ((opt.gaps == 1) && (pSVar5->encoding == MFM)) {
          _gap3 = (pointer)((ulong)_gap3 & 0xffffffff00000000);
          pDVar7 = Sector::data_copy(pSVar5,0);
          iVar3 = Sector::size(pSVar5);
          bVar1 = test_remove_gap3(pDVar7,iVar3,&gap3);
          if (bVar1) {
            Sector::remove_gapdata(pSVar5,true);
            uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
            if (pSVar5->gap3 == 0) {
              pSVar5->gap3 = gap3;
            }
          }
        }
        goto LAB_001634dc;
      }
      Sector::remove_gapdata(pSVar5,false);
      pSVar6 = (Sector *)CONCAT71((int7)((ulong)pSVar6 >> 8),1);
    }
    else {
LAB_001634dc:
      pSVar6 = (Sector *)(uVar14 & 0xffffffff);
    }
    uVar15 = uVar16 + 1;
  }
  iVar3 = 0;
  while( true ) {
    iVar4 = Track::size(track);
    uVar13 = (undefined7)((ulong)pSVar6 >> 8);
    if (iVar4 <= iVar3) break;
    pSVar5 = Track::operator[](track,iVar3);
    iVar4 = Track::size(track);
    if (((iVar3 == iVar4 + -1) && (opt.gap4b == 0)) && (bVar1 = Sector::has_gapdata(pSVar5), bVar1))
    {
      Sector::remove_gapdata(pSVar5,true);
      pSVar6 = (Sector *)CONCAT71(uVar13,1);
    }
    if (opt.datarate != Unknown) {
      pSVar5->datarate = opt.datarate;
      pSVar6 = (Sector *)CONCAT71((int7)((ulong)pSVar6 >> 8),1);
    }
    if (opt.encoding != Unknown) {
      pSVar5->encoding = opt.encoding;
      pSVar6 = (Sector *)CONCAT71((int7)((ulong)pSVar6 >> 8),1);
    }
    if (opt.gap3 != -1) {
      pSVar5->gap3 = opt.gap3 & 0xff;
    }
    iVar3 = iVar3 + 1;
  }
  if (((opt.fix != 0) && (local_190->cyl == 0)) && (iVar3 = Track::size(track), iVar3 == 9)) {
    pSVar5 = Track::operator[](track,1);
    iVar3 = Sector::copies(pSVar5);
    if ((iVar3 == 1) && (bVar1 = IsSpectrumSpeedlockTrack(track,&weak_offset,&weak_size), bVar1)) {
      if (opt.fix == 1) {
        pvVar8 = &Sector::data_copy(pSVar5,0)->
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3,pvVar8);
        for (lVar9 = (long)weak_offset;
            lVar9 < (int)((_Rb_tree_color)cStack_180._M_current - (int)_gap3); lVar9 = lVar9 + 1) {
          _gap3[lVar9] = ~_gap3[lVar9];
        }
        Sector::add(pSVar5,(Data *)&gap3,true,0xfb);
        Message<>(msgFix,"added suitable second copy of +3 Speedlock weak sector");
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3);
        pSVar6 = (Sector *)CONCAT71(uVar13,1);
      }
      else {
        Message<>(msgWarning,"missing multiple copies of +3 Speedlock weak sector");
      }
    }
    pSVar5 = Track::operator[](track,7);
    iVar3 = Sector::copies(pSVar5);
    if ((iVar3 == 1) && (bVar1 = IsCpcSpeedlockTrack(track,&weak_offset,&weak_size), bVar1)) {
      if (opt.fix == 1) {
        pvVar8 = &Sector::data_copy(pSVar5,0)->
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3,pvVar8);
        for (lVar9 = (long)weak_offset;
            lVar9 < (int)((_Rb_tree_color)cStack_180._M_current - (int)_gap3); lVar9 = lVar9 + 1) {
          _gap3[lVar9] = ~_gap3[lVar9];
        }
        Sector::add(pSVar5,(Data *)&gap3,true,0xfb);
        Message<>(msgFix,"added suitable second copy of CPC Speedlock weak sector");
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3);
        pSVar6 = (Sector *)CONCAT71((int7)((ulong)pSVar6 >> 8),1);
      }
      else {
        Message<>(msgWarning,"missing multiple copies of CPC Speedlock weak sector");
      }
    }
  }
  if (((opt.fix != 0) && (local_190->cyl == 0x28)) && (iVar3 = Track::size(track), iVar3 == 9)) {
    pSVar5 = Track::operator[](track,1);
    iVar3 = Sector::copies(pSVar5);
    if ((iVar3 == 1) && (bVar1 = IsRainbowArtsTrack(track,&weak_offset,&weak_size), bVar1)) {
      if (opt.fix == 1) {
        bVar1 = Sector::has_baddatacrc(pSVar5);
        if (!bVar1) {
          pvVar8 = &Sector::data_copy(pSVar5,0)->
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3,pvVar8);
          Sector::remove_data(pSVar5);
          Sector::add(pSVar5,(Data *)&gap3,true,0xfb);
          if (opt.debug != 0) {
            util::operator<<((LogHelper *)&util::cout,
                             (char (*) [52])"added missing data CRC error to Rainbow Arts track\n");
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3);
        }
        pvVar8 = &Sector::data_copy(pSVar5,0)->
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3,pvVar8);
        for (lVar9 = (long)weak_offset;
            lVar9 < (int)((_Rb_tree_color)cStack_180._M_current - (int)_gap3); lVar9 = lVar9 + 1) {
          _gap3[lVar9] = ~_gap3[lVar9];
        }
        Sector::add(pSVar5,(Data *)&gap3,true,0xfb);
        Message<>(msgFix,"added suitable second copy of Rainbow Arts weak sector");
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3);
        pSVar6 = (Sector *)CONCAT71((int7)((ulong)pSVar6 >> 8),1);
      }
      else {
        Message<>(msgWarning,"missing multiple copies of Rainbow Arts weak sector");
      }
    }
  }
  uVar11 = SUB84(pSVar6,0);
  if (((opt.fix != 0) && (local_190->cyl == 0x28)) && (iVar3 = Track::size(track), iVar3 == 9)) {
    pSVar5 = Track::operator[](track,7);
    this = Track::operator[](track,8);
    bVar1 = Sector::has_data(pSVar5);
    if (((bVar1) && (iVar3 = Sector::data_size(this), iVar3 == 0)) &&
       (bVar1 = IsOperaSoftTrack(track), bVar1)) {
      if (opt.fix == 1) {
        pDVar7 = Sector::data_copy(pSVar5,0);
        fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,0x55);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3,0x100,
                   (value_type *)&fill8,(allocator_type *)&str_method);
        fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,0xe8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3,(uchar *)&fill8);
        fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,0x9f);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3,(uchar *)&fill8);
        str_method._M_dataplus._M_p._0_1_ = 0x4e;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (long)(int)((gap3 - (_Rb_tree_color)cStack_180._M_current) + 0x512),
                   (value_type *)&str_method,(allocator_type *)&key);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gap3,cStack_180,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&gap3,cStack_180,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        Sector::remove_data(this);
        Sector::add(this,(Data *)&gap3,true,0xfb);
        Message<>(msgFix,"added missing data to OperaSoft 32K sector");
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fill8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gap3);
        uVar11 = (undefined4)CONCAT71((int7)((ulong)pSVar6 >> 8),1);
      }
      else {
        Message<>(msgWarning,"missing data in OperaSoft 32K sector");
      }
    }
  }
  local_194 = uVar11;
  if (((opt.fix != 0) && (iVar3 = Track::size(track), iVar3 == 0xd)) &&
     ((pSVar6 = Track::operator[](track,6), (pSVar6->header).sector == 0xc &&
      (bVar1 = IsPrehistorikTrack(track), bVar1)))) {
    if (opt.fix == 1) {
      while (iVar3 = Track::size(track), 7 < iVar3) {
        Track::remove(&local_b0,(char *)track);
        std::vector<Data,_std::allocator<Data>_>::~vector(&local_88);
      }
      Message<>(msgFix,"removed unused KBI-19 sectors from end of Prehistorik track");
      local_194 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    else {
      Message<>(msgWarning,"6 junk KBI-19 sectors found (use --fix to remove)");
    }
  }
  if ((opt.fix != 0) && (iVar3 = Track::size(track), iVar3 == 10)) {
    pSVar5 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pSVar6 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_start; pSVar6 != pSVar5; pSVar6 = pSVar6 + 1) {
      iVar3 = Sector::size(pSVar6);
      if ((iVar3 == 0x200) && (bVar1 = Sector::has_good_data(pSVar6), bVar1)) {
        pDVar7 = Sector::data_copy(pSVar6,0);
        puVar12 = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar3 = bcmp(puVar12,"",6);
        if (iVar3 == 0) {
          iVar3 = *(int *)&(pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (int)puVar12;
          if (iVar3 < 6) {
            iVar3 = 5;
          }
          uVar14 = (ulong)(iVar3 - 5);
          while (bVar1 = uVar14 != 0, uVar14 = uVar14 - 1, bVar1) {
            if ((*puVar12 == 0xdd) &&
               (iVar3 = bcmp(puVar12,NormaliseTrack::prot_check,5), iVar3 == 0)) {
              if (opt.fix == 1) {
                puVar12[3] = 0xaf;
                type = msgFix;
                pcsz_ = "disabled problematic Reussir protection";
              }
              else {
                type = msgWarning;
                pcsz_ = "detected problematic Reussir protection (use --fix to disable)";
              }
              Message<>(type,pcsz_);
              break;
            }
            puVar12 = puVar12 + 1;
          }
        }
      }
    }
  }
  uVar15 = local_194;
  if ((opt.check8k == 0) || (bVar1 = Track::is_8k_sector(track), !bVar1)) goto LAB_00163cf5;
  pSVar6 = Track::operator[](track,0);
  iVar3 = Sector::copies(pSVar6);
  if (iVar3 != 1) goto LAB_00163cf5;
  pSVar6 = Track::operator[](track,0);
  iVar3 = Sector::data_size(pSVar6);
  if (iVar3 < 0x1801) goto LAB_00163cf5;
  pSVar6 = Track::operator[](track,0);
  pDVar7 = Sector::data_copy(pSVar6,0);
  std::mutex::lock(&NormaliseTrack::map_mutex);
  key.first = (pSVar6->header).sector;
  key.second = pSVar6->dam;
  if ((NormaliseTrack(CylHead_const&,Track&)::methods_map == '\0') &&
     (iVar3 = __cxa_guard_acquire(&NormaliseTrack(CylHead_const&,Track&)::methods_map), iVar3 != 0))
  {
    NormaliseTrack::methods_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    NormaliseTrack::methods_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    NormaliseTrack::methods_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &NormaliseTrack::methods_map._M_t._M_impl.super__Rb_tree_header._M_header;
    NormaliseTrack::methods_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &NormaliseTrack::methods_map._M_t._M_impl.super__Rb_tree_header._M_header;
    NormaliseTrack::methods_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(std::
                 map<std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>,_std::less<std::pair<int,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>_>_>_>
                 ::~map,&NormaliseTrack::methods_map,&__dso_handle);
    __cxa_guard_release(&NormaliseTrack(CylHead_const&,Track&)::methods_map);
  }
  this_00 = (_Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
             *)std::
               map<std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>,_std::less<std::pair<int,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>_>_>_>
               ::operator[](&NormaliseTrack::methods_map,&key);
  buf = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)&gap3
                  ,buf,*(int *)&(pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (int)buf);
  if (*(long *)(this_00 + 0x28) == 0) {
    if (local_160 == 0) {
      fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      std::
      _Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
      ::_M_assign_unique<ChecksumType_const*>
                (this_00,(ChecksumType *)&fill8,
                 (ChecksumType *)
                 ((long)&fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 4));
    }
    else {
      std::
      _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
      ::operator=((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                   *)this_00,
                  (_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                   *)&gap3);
    }
  }
  fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fill8.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<ChecksumType>,std::_Rb_tree_const_iterator<ChecksumType>,std::insert_iterator<std::set<ChecksumType,std::less<ChecksumType>,std::allocator<ChecksumType>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_170,(_Base_ptr)&cStack_180,*(undefined8 *)(this_00 + 0x18),
             (_Base_ptr)(this_00 + 8),&fill8);
  str_method._M_dataplus._M_p = str_method._M_dataplus._M_p & 0xffffffff00000000;
  iVar10 = std::
           _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
           ::find((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                   *)&gap3,(key_type *)&str_method);
  if (iVar10._M_node == (_Base_ptr)&cStack_180) {
    if (*(long *)(this_00 + 0x28) == 0) {
      puVar12 = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar3 = *(int *)&(pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (int)puVar12;
      if (iVar3 < 0x1802) {
        if (iVar3 == 0x1801) {
          uVar2 = puVar12[0x1800];
          goto LAB_00163e85;
        }
      }
      else {
        uVar2 = puVar12[0x1800];
        if (uVar2 == puVar12[0x1801]) {
LAB_00163e85:
          if (uVar2 != '\0') {
            str_method._M_dataplus._M_p = CH(local_190->cyl,local_190->head);
            Message<unsigned_char_const&,char_const*>
                      (msgWarning,"unknown or invalid 6K checksum [%02X] on %s",puVar12 + 0x1800,
                       (char **)&str_method);
          }
        }
        else {
          str_method._M_dataplus._M_p = CH(local_190->cyl,local_190->head);
          Message<unsigned_char_const&,unsigned_char_const&,char_const*>
                    (msgWarning,"unknown or invalid 6K checksum [%02X %02X] on %s",puVar12 + 0x1800,
                     puVar12 + 0x1801,(char **)&str_method);
        }
      }
    }
    else if (*(long *)(this_00 + 0x28) == 1) {
      str_method._M_dataplus._M_p = str_method._M_dataplus._M_p & 0xffffffff00000000;
      iVar10 = std::
               _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
               ::find((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                       *)this_00,(key_type *)&str_method);
      if (iVar10._M_node == (_Base_ptr)(this_00 + 8)) {
        std::
        _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
        ::_Rb_tree(&local_e0,
                   (_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                    *)this_00);
        ChecksumName_abi_cxx11_
                  (&str_method,
                   (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                   &local_e0);
        std::
        _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
        ::~_Rb_tree(&local_e0);
        uVar16 = *(uint *)(*(long *)(this_00 + 0x18) + 0x20);
        if (uVar16 < 7) {
          if ((0x1cU >> (uVar16 & 0x1f) & 1) == 0) {
            bVar1 = true;
            if ((0x62U >> (uVar16 & 0x1f) & 1) == 0) goto LAB_00163daf;
            goto LAB_00163db1;
          }
LAB_00163dc6:
          local_148 = str_method._M_dataplus._M_p;
          puVar12 = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_e8 = CH(local_190->cyl,local_190->head);
          Message<char_const*,unsigned_char_const&,char_const*>
                    (msgWarning,"invalid %s checksum [%02X] on %s",&local_148,puVar12 + 0x1800,
                     &local_e8);
        }
        else {
LAB_00163daf:
          bVar1 = false;
LAB_00163db1:
          puVar12 = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (*(int *)&(pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (int)puVar12 < 0x1802) goto LAB_00163dc6;
          if (bVar1) {
            local_148 = str_method._M_dataplus._M_p;
            local_e8 = CH(local_190->cyl,local_190->head);
            Message<char_const*,unsigned_char_const&,unsigned_char_const&,char_const*>
                      (msgWarning,"invalid %s checksum [%02X %02X] on %s",&local_148,
                       puVar12 + 0x1800,puVar12 + 0x1801,&local_e8);
          }
        }
        std::__cxx11::string::~string((string *)&str_method);
      }
    }
  }
  std::
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  ::~_Rb_tree((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
               *)&fill8);
  std::
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  ::~_Rb_tree((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
               *)&gap3);
  pthread_mutex_unlock((pthread_mutex_t *)&NormaliseTrack::map_mutex);
LAB_00163cf5:
  return (bool)((byte)uVar15 & 1);
}

Assistant:

bool NormaliseTrack(const CylHead& cylhead, Track& track)
{
    bool changed = false;
    int i;

    // Clear the track length if offsets are disabled (cosmetic: no changed flag).
    if (opt.offsets == 0)
        track.tracklen = 0;

    // Pass 1
    for (i = 0; i < track.size(); ++i)
    {
        auto& sector = track[i];

        // Remove sectors with duplicate CHRN?
        if (opt.nodups)
        {
            // Remove duplicates found later on the track.
            for (int j = i + 1; j < track.size(); ++j)
            {
                auto& s = track[j];
                if (s.header.compare_chrn(sector.header) && s.encoding == sector.encoding)
                {
                    track.remove(j--);
                    changed = true;
                }
            }
        }

        // Clear all data, for privacy during diagnostics?
        if (opt.nodata && sector.has_data())
        {
            sector.remove_data();
            sector.add(Data());     // empty data rather than no data
            changed = true;
        }

        // Track offsets disabled? (cosmetic: no changed flag)
        if (opt.offsets == 0)
            sector.offset = 0;
#if 0
        // ToDo: move this to fdrawcmd disk type
        // Build ASRock corruption check block
        if (i < (int)arraysize(ah))
        {
            ah[i].cyl = sector.header.cyl;
            ah[i].head = sector.header.head;
            ah[i].sector = sector.header.sector;
            ah[i].size = sector.header.size;
        }
#endif

        if (sector.has_gapdata())
        {
            // Remove gap data if disabled, or the gap mask doesn't allow it
            if (opt.gaps == GAPS_NONE || !(opt.gapmask & (1 << i)))
            {
                sector.remove_gapdata();
                changed = true;
            }
            // Remove normal gaps unless we're asked to keep them.
            else if (opt.gaps == GAPS_CLEAN && sector.encoding == Encoding::MFM)
            {
                int gap3 = 0;
                if (test_remove_gap3(sector.data_copy(), sector.size(), gap3))
                {
                    sector.remove_gapdata(true);
                    changed = true;

                    if (!sector.gap3)
                        sector.gap3 = gap3;
                }
            }
        }
#if 0
        // ToDo: move this to affected disk types
        // Check for short sector wrapping the track end (includes logoprof.dmk and Les Justiciers 2 [1B].scp [CPC])
        // Also check it doesn't trigger in cyl 18 sector 5 of Super Sprint (KryoFlux).
        if (ps->uData > 0 && tracklen > 0 && ps->offset > 0 &&
            ps->uData < uSize &&
            GetDataExtent(i) > uSize &&
            (ps->offset + GetSectorOverhead(encrate) + uSize) > tracklen)
        {
            Message(msgWarning, "%s truncated at end of track data", CHSR(cyl, head, i, ps->sector));
        }
#endif
    }

    // Pass 2
    for (i = 0; i < track.size(); ++i)
    {
        Sector& sector = track[i];

        // Remove only the final gap if --no-gap4b was used
        if (i == (track.size() - 1) && opt.gap4b == 0 && sector.has_gapdata())
        {
            sector.remove_gapdata(true);
            changed = true;
        }

        // Allow override for sector datarate.
        if (opt.datarate != DataRate::Unknown)
        {
            sector.datarate = opt.datarate;
            changed = true;
        }

        // Allow override for sector encoding.
        if (opt.encoding != Encoding::Unknown)
        {
            sector.encoding = opt.encoding;
            changed = true;
        }

        // Allow overrides for track gap3 (cosmetic: no changed flag)
        if (opt.gap3 != -1)
            sector.gap3 = static_cast<uint8_t>(opt.gap3);
#if 0
        // ToDo: move this to fdrawcmd disk type
        // Check for the ASRock FDC problem that corrupts sector data with format headers (unless comparison block is all one byte)
        int nn = sizeof(ah) - sizeof(ah[0]) - 1;
        if (sectors > 1 && ps->apbData[0] && memcmp(ps->apbData[0], ps->apbData[0] + 1, sizeof(ah) - 1))
        {
            // Ignore the first sector and size in case of a placeholder sector
            if (!memcmp(&ah[1], ps->apbData[0] + sizeof(ah[0]), sizeof(ah) - sizeof(ah[0])))
                Message(msgWarning, "possible FDC data corruption on %s", CHSR(cyl, head, i, ps->sector));
        }
#endif
    }

    int weak_offset, weak_size;

    // Check for Speedlock weak sector (either +3 or CPC)
    if (opt.fix != 0 && cylhead.cyl == 0 && track.size() == 9)
    {
        auto& sector1 = track[1];
        if (sector1.copies() == 1 && IsSpectrumSpeedlockTrack(track, weak_offset, weak_size))
        {
            // Are we to add the missing weak sector?
            if (opt.fix == 1)
            {
                // Add a copy with differences matching the typical weak sector
                auto data = sector1.data_copy();
                for (i = weak_offset; i < data.size(); ++i)
                    data[i] = ~data[i];
                sector1.add(std::move(data), true);

                Message(msgFix, "added suitable second copy of +3 Speedlock weak sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing multiple copies of +3 Speedlock weak sector");
        }

        auto& sector7 = track[7];
        if (sector7.copies() == 1 && IsCpcSpeedlockTrack(track, weak_offset, weak_size))
        {
            // Are we to add the missing weak sector?
            if (opt.fix == 1)
            {
                // Add a second data copy with differences matching the typical weak sector
                auto data = sector7.data_copy();
                for (i = weak_offset; i < data.size(); ++i)
                    data[i] = ~data[i];
                sector7.add(std::move(data), true);

                Message(msgFix, "added suitable second copy of CPC Speedlock weak sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing multiple copies of CPC Speedlock weak sector");
        }
    }

    // Check for Rainbow Arts weak sector missing copies
    if (opt.fix != 0 && cylhead.cyl == 40 && track.size() == 9)
    {
        auto& sector1 = track[1];
        if (sector1.copies() == 1 && IsRainbowArtsTrack(track, weak_offset, weak_size))
        {
            // Are we to add the missing weak sector?
            if (opt.fix == 1)
            {
                // Ensure the weak sector has a data CRC error, to fix broken CPCDiskXP images
                if (!sector1.has_baddatacrc())
                {
                    auto data = sector1.data_copy();
                    sector1.remove_data();
                    sector1.add(std::move(data), true);
                    if (opt.debug) util::cout << "added missing data CRC error to Rainbow Arts track\n";
                }

                // Add a second data copy with differences matching the typical weak sector
                auto data = sector1.data_copy();
                for (i = weak_offset; i < data.size(); ++i)
                    data[i] = ~data[i];
                sector1.add(std::move(data), true);

                Message(msgFix, "added suitable second copy of Rainbow Arts weak sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing multiple copies of Rainbow Arts weak sector");
        }
    }

    // Check for missing OperaSoft 32K sector (CPDRead dumps).
    if (opt.fix != 0 && cylhead.cyl == 40 && track.size() == 9)
    {
        auto& sector7 = track[7];
        auto& sector8 = track[8];
        if (sector7.has_data() && sector8.data_size() == 0 && IsOperaSoftTrack(track))
        {
            if (opt.fix == 1)
            {
                const auto& data7 = sector7.data_copy();

                // Add 0x55 data and correct CRC for 256 bytes
                auto data8{ Data(256, 0x55) };
                data8.push_back(0xe8);
                data8.push_back(0x9f);

                // Fill up to the protection check with gap filler
                auto fill8{ Data(0x512 - data8.size(), 0x4e) };
                data8.insert(data8.end(), fill8.begin(), fill8.end());

                // Append sector 7 data to offset 0x512 to pass the protection check.
                data8.insert(data8.end(), data7.begin(), data7.end());

                // Replace any existing sector 8 data with out hand-crafted version.
                sector8.remove_data();
                sector8.add(std::move(data8), true);

                Message(msgFix, "added missing data to OperaSoft 32K sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing data in OperaSoft 32K sector");
        }
    }

    // Check for Prehistorik track followed by unused KBI-19 sectors (mastering error?).
    if (opt.fix != 0 && track.size() == 13)
    {
        if (track[6].header.sector == 12 && IsPrehistorikTrack(track))
        {
            if (opt.fix == 1)
            {
                // Trim the unwanted sectors.
                while (track.size() > 7)
                {
                    track.remove(7);
                    changed = true;
                }

                Message(msgFix, "removed unused KBI-19 sectors from end of Prehistorik track");
                changed = true;
            }
            else
                Message(msgWarning, "6 junk KBI-19 sectors found (use --fix to remove)");
        }
    }

    // Check for the problematic Reussir protection (CPC).
    if (opt.fix != 0 && track.size() == 10)
    {
        for (auto& s : track)
        {
            if (s.size() != 512 || !s.has_good_data())
                continue;

            auto& data = s.data_copy();
            if (std::memcmp(data.data(), "\0LANCE", 6))
                continue;

            // LD A,(IX+0); CP (HL); JR NZ,e
            static const uint8_t prot_check[]{ 0xdd, 0x7e, 0x00, 0xbe, 0x20 };

            for (i = 0; i < data.size() - static_cast<int>(sizeof(prot_check)); ++i)
            {
                if (data[i] == 0xdd && !memcmp(data.data() + i, prot_check, sizeof(prot_check)))
                {
                    // Are we to fix (disable) the protection?
                    if (opt.fix == 1)
                    {
                        data[i + 3] = 0xaf; // XOR A
                        Message(msgFix, "disabled problematic Reussir protection");
                    }
                    else
                        Message(msgWarning, "detected problematic Reussir protection (use --fix to disable)");
                    break;
                }
            }
        }
    }

    // Single copy of an 8K sector?
    if (opt.check8k != 0 && track.is_8k_sector() && track[0].copies() == 1 && track[0].data_size() >= 0x1801)
    {
        const auto& sector = track[0];
        const auto& data = sector.data_copy();

        static std::mutex map_mutex;
        std::lock_guard<std::mutex> lock(map_mutex);

        // The checksum method can change within a disk, but usually corresponds
        // to a change in sector id or DAM type. Fun Radio [2B] (CPC) does this.
        auto key = std::make_pair(sector.header.sector, sector.dam);
        static std::map<decltype(key), std::set<ChecksumType>> methods_map;
        auto& disk_methods = methods_map[key];

        // Determine the potential 8K checksum methods, if any.
        auto sector_methods = ChecksumMethods(data.data(), data.size());

        if (disk_methods.empty())
        {
            // First of key type follows first sector, or None.
            if (!sector_methods.empty())
                disk_methods = sector_methods;
            else
                disk_methods = { ChecksumType::None };
        }

        // Determine which common methods between disk and sector.
        std::set<ChecksumType> common_methods{};
        std::set_intersection(
            sector_methods.begin(), sector_methods.end(),
            disk_methods.begin(), disk_methods.end(),
            std::inserter(common_methods, common_methods.begin()));

        if (sector_methods.find(ChecksumType::None) != sector_methods.end())
        {
            // If None is an option, there's no checksum.
        }
        else if (common_methods.size() == 1)
        {
            // A single match means a good sector, so have the disk follow it.
            if (disk_methods.size() > 1)
                disk_methods = common_methods;
        }
        else if (disk_methods.empty())
        {
            // Unrecognised 8K method, probably the first on track containing one.
            // Ignore two matching bytes, or a single zero, as likely junk.
            if (data.size() >= 0x1802 && (data[0x1800] != data[0x1801]))
            {
                Message(msgWarning, "unknown or invalid 6K checksum [%02X %02X] on %s",
                    data[0x1800], data[0x1801], CH(cylhead.cyl, cylhead.head));
            }
            else if (data.size() >= 0x1801 && data[0x1800])
            {
                Message(msgWarning, "unknown or invalid 6K checksum [%02X] on %s",
                    data[0x1800], CH(cylhead.cyl, cylhead.head));
            }
        }
        else if (disk_methods.size() == 1 && common_methods.empty() &&
            disk_methods.find(ChecksumType::None) == disk_methods.end())
        {
            // The disk has a method, which the sector lacks. Probably bad.
            auto str_method = ChecksumName(disk_methods);
            auto checksum_len = ChecksumLength(*disk_methods.begin());

            if (checksum_len == 1 || data.size() < 0x1802)
            {
                Message(msgWarning, "invalid %s checksum [%02X] on %s",
                    str_method.c_str(), data[0x1800], CH(cylhead.cyl, cylhead.head));
            }
            else if (checksum_len == 2)
            {
                Message(msgWarning, "invalid %s checksum [%02X %02X] on %s",
                    str_method.c_str(), data[0x1800], data[0x1801],
                    CH(cylhead.cyl, cylhead.head));
            }
        }
    }

    // Return whether the supplied track was modified.
    return changed;
}